

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O2

void __thiscall
cppcms::widgets::base_html_input::base_html_input(base_html_input *this,void **vtt,string *type)

{
  _func_int **pp_Var1;
  
  pp_Var1 = (_func_int **)*vtt;
  this->_vptr_base_html_input = pp_Var1;
  *(void **)((long)&this->_vptr_base_html_input + (long)pp_Var1[-3]) = vtt[1];
  (this->d).ptr_ = (_data *)0x0;
  std::__cxx11::string::string((string *)&this->type_,(string *)type);
  return;
}

Assistant:

base_html_input::base_html_input(std::string const &type) : type_(type) {}